

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RawMsg.h
# Opt level: O1

void __thiscall SocketPP::RawMsg::RawMsg(RawMsg *this,RawMsg *msg)

{
  ulong __n;
  byte *__src;
  byte *__dest;
  
  this->len_ = 0;
  this->data_ = (byte *)0x0;
  __n = msg->len_;
  __src = msg->data_;
  if (__src == (byte *)0x0 || __n == 0) {
    this->len_ = 0;
    this->data_ = (byte *)0x0;
    return;
  }
  this->len_ = __n;
  __dest = (byte *)operator_new__(__n);
  this->data_ = __dest;
  memcpy(__dest,__src,__n);
  return;
}

Assistant:

RawMsg(const RawMsg& msg) {
        initMsg(msg.data_, msg.len_);
    }